

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.hpp
# Opt level: O0

void __thiscall Excel::Book::onCell(Book *this,size_t sheetIdx,Formula *formula)

{
  int16_t iVar1;
  Sheet *pSVar2;
  Formula *this_00;
  Formula *value;
  Formula *in_RDX;
  size_t in_stack_00000158;
  Book *in_stack_00000160;
  undefined1 *column;
  size_t in_stack_ffffffffffffff98;
  Sheet *in_stack_ffffffffffffffa0;
  undefined1 local_58 [64];
  Formula *local_18;
  
  local_18 = in_RDX;
  pSVar2 = sheet(in_stack_00000160,in_stack_00000158);
  iVar1 = Formula::getRow(local_18);
  this_00 = (Formula *)(long)iVar1;
  iVar1 = Formula::getColumn(local_18);
  value = (Formula *)(long)iVar1;
  column = local_58;
  Formula::Formula(this_00,(Formula *)pSVar2);
  Sheet::setCell<Excel::Formula>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)column,value);
  Formula::~Formula((Formula *)0x12aeed);
  return;
}

Assistant:

inline void
Book::onCell( size_t sheetIdx, const Formula & formula )
{
	sheet( sheetIdx )->setCell( formula.getRow(), formula.getColumn(), formula );
}